

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddReord.c
# Opt level: O0

int Cudd_zddReduceHeap(DdManager *table,Cudd_ReorderingType heuristic,int minsize)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  abctime aVar4;
  int res_1;
  int res;
  long localTime;
  uint nextDyn;
  int result;
  DdHook *hook;
  int minsize_local;
  Cudd_ReorderingType heuristic_local;
  DdManager *table_local;
  
  if (table->keysZ - table->deadZ < (uint)minsize) {
    table_local._4_4_ = 1;
  }
  else {
    hook._4_4_ = heuristic;
    if (heuristic == CUDD_REORDER_SAME) {
      hook._4_4_ = table->autoMethodZ;
    }
    if (hook._4_4_ == CUDD_REORDER_NONE) {
      table_local._4_4_ = 1;
    }
    else {
      table->reorderings = table->reorderings + 1;
      empty = table->zero;
      pvVar3 = (void *)Extra_CpuTime();
      for (_nextDyn = table->preReorderingHook; _nextDyn != (DdHook *)0x0; _nextDyn = _nextDyn->next
          ) {
        iVar1 = (*_nextDyn->f)(table,"ZDD",(void *)hook._4_4_);
        if (iVar1 == 0) {
          return 0;
        }
      }
      zddReorderPreprocess(table);
      zddTotalNumberSwapping = 0;
      table_local._4_4_ = cuddZddTreeSifting(table,hook._4_4_);
      if (table_local._4_4_ == 0) {
        table_local._4_4_ = 0;
      }
      else {
        iVar1 = zddReorderPostprocess(table);
        if (iVar1 == 0) {
          table_local._4_4_ = 0;
        }
        else if ((table->realignZ == 0) || (iVar1 = cuddBddAlignToZdd(table), iVar1 != 0)) {
          uVar2 = table->keysZ << 1;
          if ((table->reorderings < 0x14) || (table->nextDyn < uVar2)) {
            table->nextDyn = uVar2;
          }
          else {
            table->nextDyn = table->nextDyn + 0x14;
          }
          table->reordered = 1;
          for (_nextDyn = table->postReorderingHook; _nextDyn != (DdHook *)0x0;
              _nextDyn = _nextDyn->next) {
            iVar1 = (*_nextDyn->f)(table,"ZDD",pvVar3);
            if (iVar1 == 0) {
              return 0;
            }
          }
          aVar4 = Extra_CpuTime();
          table->reordTime = (aVar4 - (long)pvVar3) + table->reordTime;
        }
        else {
          table_local._4_4_ = 0;
        }
      }
    }
  }
  return table_local._4_4_;
}

Assistant:

int
Cudd_zddReduceHeap(
  DdManager * table /* DD manager */,
  Cudd_ReorderingType heuristic /* method used for reordering */,
  int minsize /* bound below which no reordering occurs */)
{
    DdHook       *hook;
    int          result;
    unsigned int nextDyn;
#ifdef DD_STATS
    unsigned int initialSize;
    unsigned int finalSize;
#endif
    long         localTime;

    /* Don't reorder if there are too many dead nodes. */
    if (table->keysZ - table->deadZ < (unsigned) minsize)
        return(1);

    if (heuristic == CUDD_REORDER_SAME) {
        heuristic = table->autoMethodZ;
    }
    if (heuristic == CUDD_REORDER_NONE) {
        return(1);
    }

    /* This call to Cudd_zddReduceHeap does initiate reordering. Therefore
    ** we count it.
    */
    table->reorderings++;
    empty = table->zero;

    localTime = util_cpu_time();

    /* Run the hook functions. */
    hook = table->preReorderingHook;
    while (hook != NULL) {
        int res = (hook->f)(table, "ZDD", (void *)heuristic);
        if (res == 0) return(0);
        hook = hook->next;
    }

    /* Clear the cache and collect garbage. */
    zddReorderPreprocess(table);
    zddTotalNumberSwapping = 0;

#ifdef DD_STATS
    initialSize = table->keysZ;

    switch(heuristic) {
    case CUDD_REORDER_RANDOM:
    case CUDD_REORDER_RANDOM_PIVOT:
        (void) fprintf(table->out,"#:I_RANDOM  ");
        break;
    case CUDD_REORDER_SIFT:
    case CUDD_REORDER_SIFT_CONVERGE:
    case CUDD_REORDER_SYMM_SIFT:
    case CUDD_REORDER_SYMM_SIFT_CONV:
        (void) fprintf(table->out,"#:I_SIFTING ");
        break;
    case CUDD_REORDER_LINEAR:
    case CUDD_REORDER_LINEAR_CONVERGE:
        (void) fprintf(table->out,"#:I_LINSIFT ");
        break;
    default:
        (void) fprintf(table->err,"Unsupported ZDD reordering method\n");
        return(0);
    }
    (void) fprintf(table->out,"%8d: initial size",initialSize); 
#endif

    result = cuddZddTreeSifting(table,heuristic);

#ifdef DD_STATS
    (void) fprintf(table->out,"\n");
    finalSize = table->keysZ;
    (void) fprintf(table->out,"#:F_REORDER %8d: final size\n",finalSize); 
    (void) fprintf(table->out,"#:T_REORDER %8g: total time (sec)\n",
                   ((double)(util_cpu_time() - localTime)/1000.0)); 
    (void) fprintf(table->out,"#:N_REORDER %8d: total swaps\n",
                   zddTotalNumberSwapping);
#endif

    if (result == 0)
        return(0);

    if (!zddReorderPostprocess(table))
        return(0);

    if (table->realignZ) {
        if (!cuddBddAlignToZdd(table))
            return(0);
    }

    nextDyn = table->keysZ * DD_DYN_RATIO;
    if (table->reorderings < 20 || nextDyn > table->nextDyn)
        table->nextDyn = nextDyn;
    else
        table->nextDyn += 20;

    table->reordered = 1;

    /* Run hook functions. */
    hook = table->postReorderingHook;
    while (hook != NULL) {
        int res = (hook->f)(table, "ZDD", (void *)localTime);
        if (res == 0) return(0);
        hook = hook->next;
    }
    /* Update cumulative reordering time. */
    table->reordTime += util_cpu_time() - localTime;

    return(result);

}